

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<int>::GetSub
          (TPZMatrix<int> *this,int64_t sRow,int64_t sCol,int64_t rowSize,int64_t colSize,
          TPZFMatrix<int> *A)

{
  long lVar1;
  long *plVar2;
  int iVar3;
  int64_t iVar4;
  long lVar5;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  TPZBaseMatrix *in_RDI;
  long in_R8;
  long *in_R9;
  int64_t c;
  int64_t col;
  int64_t r;
  int64_t row;
  char *in_stack_00000168;
  char *in_stack_00000170;
  int local_5c;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long *local_38;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  iVar4 = TPZBaseMatrix::Rows(in_RDI);
  if ((in_RSI + in_RCX <= iVar4) &&
     (lVar5 = local_20 + local_30, iVar4 = TPZBaseMatrix::Cols(in_RDI), lVar5 <= iVar4)) {
    (**(code **)(*local_38 + 0x68))(local_38,local_28,local_30);
    local_40 = local_18;
    for (local_48 = 0; local_48 < local_28; local_48 = local_48 + 1) {
      local_50 = local_20;
      for (local_58 = 0; plVar2 = local_38, lVar1 = local_48, lVar5 = local_58, local_58 < local_30;
          local_58 = local_58 + 1) {
        local_5c = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_40,local_50);
        (**(code **)(*plVar2 + 0x118))(plVar2,lVar1,lVar5,&local_5c);
        local_50 = local_50 + 1;
      }
      local_40 = local_40 + 1;
    }
    return 1;
  }
  iVar3 = Error(in_stack_00000170,in_stack_00000168);
  return iVar3;
}

Assistant:

int TPZMatrix<TVar>::GetSub(const int64_t sRow,const int64_t sCol,const int64_t rowSize,
							const int64_t colSize, TPZFMatrix<TVar> & A ) const {
    if ( ((sRow + rowSize) > Rows()) || ((sCol + colSize) > Cols()) ) {
        return( Error( "GetSub <t.he sub-matrix is too big>" ) );
    }
    A.Resize( rowSize, colSize );
    int64_t row = sRow;
    for ( int64_t r = 0; r < rowSize; r++, row++ ) {
        int64_t col = sCol;
        for ( int64_t c = 0; c < colSize; c++, col++ ) {
            A.PutVal( r, c, GetVal( row, col ) );
        }
    }
    return( 1 );
}